

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Node::resolveMember
          (Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Node *this,StringPtr name)

{
  Maybe<capnp::compiler::Compiler::Node::Content_&> MVar1;
  iterator iVar2;
  iterator iVar3;
  StringPtr name_local;
  OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
  local_80;
  
  name_local.content.size_ = name.content.size_;
  name_local.content.ptr = name.content.ptr;
  if ((this->isBuiltin != true) && (MVar1 = getContent(this,EXPANDED), MVar1.ptr != (Content *)0x0))
  {
    iVar2 = std::
            _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_>_>_>
            ::find(&((MVar1.ptr)->nestedNodes)._M_t,&name_local);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &((MVar1.ptr)->nestedNodes)._M_t._M_impl.super__Rb_tree_header) {
      local_80.field_1._32_8_ = iVar2._M_node[1]._M_right;
      local_80.field_1.forceAligned = ((_Base_ptr)(local_80.field_1._32_8_ + 0x40))->_M_parent;
      local_80.field_1._8_4_ =
           *(undefined4 *)&((_Base_ptr)(local_80.field_1._32_8_ + 0x60))->field_0x4;
      local_80.field_1._16_8_ = this->id;
      local_80.field_1._24_2_ = (undefined2)((_Base_ptr)(local_80.field_1._32_8_ + 0x60))->_M_color;
      local_80.field_1.space[0x28] = '\0';
      local_80.tag = 1;
      kj::_::
      NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
      ::NullableValue(&__return_storage_ptr__->ptr,&local_80);
      return __return_storage_ptr__;
    }
    iVar3 = std::
            _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>_>_>
            ::find(&((MVar1.ptr)->aliases)._M_t,&name_local);
    if ((_Rb_tree_header *)iVar3._M_node !=
        &((MVar1.ptr)->aliases)._M_t._M_impl.super__Rb_tree_header) {
      Alias::compile(__return_storage_ptr__,(Alias *)iVar3._M_node[1]._M_right);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::Resolver::ResolveResult>
Compiler::Node::resolveMember(kj::StringPtr name) {
  if (isBuiltin) return nullptr;

  KJ_IF_MAYBE(content, getContent(Content::EXPANDED)) {
    {
      auto iter = content->nestedNodes.find(name);
      if (iter != content->nestedNodes.end()) {
        Node* node = iter->second;
        ResolveResult result;
        result.init<ResolvedDecl>(ResolvedDecl {
            node->id, node->genericParamCount, id, node->kind, node, nullptr });
        return result;
      }
    }
    {
      auto iter = content->aliases.find(name);
      if (iter != content->aliases.end()) {
        return iter->second->compile();
      }
    }
  }
  return nullptr;
}